

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

bool sqlcheck::IsCreateStatement(string *sql_statement)

{
  long lVar1;
  string create_table_template;
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"create table",&local_31);
  lVar1 = std::__cxx11::string::find((string *)sql_statement,(ulong)local_30);
  std::__cxx11::string::~string(local_30);
  return lVar1 != -1;
}

Assistant:

bool IsCreateStatement(const std::string& sql_statement){
  std::string create_table_template = "create table";
  std::size_t found = sql_statement.find(create_table_template);
  if (found != std::string::npos) {
    return true;
  }

  return false;
}